

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  lu_int32 *plVar1;
  uint uVar2;
  global_State *pgVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  GCObject *pGVar7;
  uint uVar8;
  size_t sVar9;
  TString *ts;
  GCObject *unaff_R13;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    uVar8 = pgVar3->seed ^ (uint)l;
    if (l != 0) {
      sVar9 = l;
      do {
        uVar8 = uVar8 ^ (uint)(byte)str[sVar9 - 1] + (uVar8 >> 2) + uVar8 * 0x20;
        sVar9 = sVar9 + ~(l >> 5);
      } while (l >> 5 < sVar9);
    }
    pGVar7 = (GCObject *)((pgVar3->strt).hash + ((long)(pgVar3->strt).size - 1U & (long)(int)uVar8))
    ;
    do {
      pGVar7 = (pGVar7->gch).next;
      if (pGVar7 == (GCObject *)0x0) {
        pgVar3 = L->l_G;
        uVar2 = (pgVar3->strt).size;
        if ((int)uVar2 < 0x3fffffff && uVar2 <= (pgVar3->strt).nuse) {
          luaS_resize(L,uVar2 * 2);
        }
        pGVar7 = luaC_newobj(L,4,l + 0x19,
                             (pgVar3->strt).hash +
                             ((long)(pgVar3->strt).size - 1U & (long)(int)uVar8),0);
        (pGVar7->h).array = (TValue *)l;
        (pGVar7->h).sizearray = uVar8;
        (pGVar7->h).flags = '\0';
        memcpy(&(pGVar7->h).node,str,l);
        *(undefined1 *)((long)pGVar7 + l + 0x18) = 0;
        plVar1 = &(pgVar3->strt).nuse;
        *plVar1 = *plVar1 + 1;
        return (TString *)pGVar7;
      }
      bVar4 = true;
      if (((uVar8 == (pGVar7->h).sizearray) && ((pGVar7->h).array == (TValue *)l)) &&
         (iVar6 = bcmp(str,&(pGVar7->h).node,l), iVar6 == 0)) {
        bVar5 = (pGVar7->gch).marked ^ 3;
        if (((L->l_G->currentwhite ^ 3) & bVar5) == 0) {
          (pGVar7->gch).marked = bVar5;
        }
        bVar4 = false;
        unaff_R13 = pGVar7;
      }
    } while (bVar4);
  }
  else {
    if (l + 0x1b < 0x1a) {
      luaM_toobig(L);
    }
    uVar8 = L->l_G->seed;
    unaff_R13 = luaC_newobj(L,0x14,l + 0x19,(GCObject **)0x0,0);
    (unaff_R13->h).array = (TValue *)l;
    (unaff_R13->h).sizearray = uVar8;
    (unaff_R13->h).flags = '\0';
    memcpy(&(unaff_R13->h).node,str,l);
    *(undefined1 *)((long)unaff_R13 + l + 0x18) = 0;
  }
  return (TString *)unaff_R13;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    if (l + 1 > (MAX_SIZET - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    return createstrobj(L, str, l, LUA_TLNGSTR, G(L)->seed, NULL);
  }
}